

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

int __thiscall Renderer::init(Renderer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Renderer *local_10;
  Renderer *this_local;
  
  local_10 = this;
  iVar1 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar1 == 0) {
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[41m\x1b[1m[ERROR]\x1b[49m\x1b[0m ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFILE\x1b[0m    : ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/tmarrec[P]fluid-simulation/src/Renderer.cpp"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFUNCTION\x1b[0m: ");
    poVar2 = std::operator<<(poVar2,"init");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mLINE\x1b[0m    : ");
    this_00 = (void *)std::ostream::operator<<(poVar2,0xd);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mMESSAGE\x1b[0m : ");
    poVar2 = std::operator<<(poVar2,"Failed to initialize glad");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  (*glad_glViewport)(0,0,(GLsizei)Config::width,(GLsizei)Config::height);
  (*glad_glEnable)(0xb71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"shaders/screen.vert",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"shaders/screen.frag",&local_69);
  initFrameBuffer(this,&this->_screenbuffer,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"shaders/screen.vert",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/raymarch.frag",&local_b9);
  initFrameBuffer(this,&this->_raymarchingbuffer,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  iVar1 = std::allocator<char>::~allocator(&local_91);
  return iVar1;
}

Assistant:

void Renderer::init()
{
    if (!gladLoadGLLoader(reinterpret_cast<GLADloadproc>(glfwGetProcAddress)))
    {
        ERROR("Failed to initialize glad");
    }

    glViewport(0, 0, Config::width, Config::height);
    glEnable(GL_DEPTH_TEST);

    initFrameBuffer(_screenbuffer,
            "shaders/screen.vert", "shaders/screen.frag");
    initFrameBuffer(_raymarchingbuffer,
            "shaders/screen.vert", "shaders/raymarch.frag");
}